

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O2

commonNaNT * float32ToCommonNaN(commonNaNT *__return_storage_ptr__,float32 a,float_status *status)

{
  if ((a & 0x3fffff) != 0 && (a & 0x7fc00000) == 0x7f800000) {
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  __return_storage_ptr__->sign = (byte)(a >> 0x1f);
  __return_storage_ptr__->low = 0;
  __return_storage_ptr__->high = (ulong)a << 0x29;
  return __return_storage_ptr__;
}

Assistant:

static commonNaNT float32ToCommonNaN(float32 a, float_status *status)
{
    commonNaNT z;

    if (float32_is_signaling_nan(a, status)) {
        float_raise(float_flag_invalid, status);
    }
    z.sign = float32_val(a) >> 31;
    z.low = 0;
    z.high = ((uint64_t)float32_val(a)) << 41;
    return z;
}